

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_symbol_get_description(JSContext *ctx,JSValue this_val)

{
  int iVar1;
  JSRuntime *pJVar2;
  uint uVar3;
  uint32_t *puVar5;
  JSAtom atom;
  JSValue v;
  JSValue JVar6;
  JSValueUnion JVar4;
  
  v = js_thisSymbolValue(ctx,this_val);
  JVar4 = v.u;
  if ((uint)v.tag != 6) {
    uVar3 = (uint)((ulong)*(undefined8 *)((long)JVar4.ptr + 4) >> 0x20);
    if (uVar3 >> 0x1e < 3) {
      pJVar2 = ctx->rt;
      puVar5 = (uint32_t *)
               ((ulong)((pJVar2->atom_hash_size - 1U & uVar3) << 2) + (long)pJVar2->atom_hash);
      do {
        atom = *puVar5;
        puVar5 = &pJVar2->atom_array[atom]->hash_next;
      } while (pJVar2->atom_array[atom] != (JSAtomStruct *)JVar4.ptr);
    }
    else {
      atom = *(uint32_t *)((long)JVar4.ptr + 0xc);
    }
    JVar6 = __JS_AtomToValue(ctx,atom,1);
    if ((0xfffffff4 < (uint)v.tag) &&
       (iVar1 = *JVar4.ptr, *(int *)JVar4.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
    v.tag = JVar6.tag;
    v.u.ptr = (void *)((ulong)JVar6.u.ptr & 0xffffffff00000000 | (ulong)JVar6.u._0_4_);
  }
  return v;
}

Assistant:

static JSValue js_symbol_get_description(JSContext *ctx, JSValueConst this_val)
{
    JSValue val, ret;
    JSAtomStruct *p;

    val = js_thisSymbolValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    p = JS_VALUE_GET_PTR(val);
    if (p->len == 0 && p->is_wide_char != 0) {
        ret = JS_UNDEFINED;
    } else {
        ret = JS_AtomToString(ctx, js_get_atom_index(ctx->rt, p));
    }
    JS_FreeValue(ctx, val);
    return ret;
}